

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<const_kj::(anonymous_namespace)::InMemoryFile>::~Own
          (Own<const_kj::(anonymous_namespace)::InMemoryFile> *this)

{
  InMemoryFile *pIVar1;
  
  pIVar1 = this->ptr;
  if (pIVar1 != (InMemoryFile *)0x0) {
    this->ptr = (InMemoryFile *)0x0;
    (**this->disposer->_vptr_Disposer)
              (this->disposer,
               (pIVar1->super_File).super_ReadableFile.super_FsNode._vptr_FsNode[-2] +
               (long)&(pIVar1->super_File).super_ReadableFile.super_FsNode._vptr_FsNode);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }